

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_1::getVectorsFromComps(Functions *gl,deUint32 pname)

{
  GLenum err;
  deBool dVar1;
  char *pcVar2;
  TestError *this;
  Enum<int,_2UL> EVar3;
  GetNameFunc local_118;
  int local_110;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  GetNameFunc local_98;
  int local_90;
  GetNameFunc local_88;
  int local_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  GLint local_18;
  deUint32 local_14;
  int value;
  deUint32 pname_local;
  Functions *gl_local;
  
  local_18 = -1;
  local_14 = pname;
  _value = gl;
  (*gl->getIntegerv)(pname,&local_18);
  err = (*_value->getError)();
  EVar3 = glu::getGettableStateStr(local_14);
  local_98 = EVar3.m_getName;
  local_90 = EVar3.m_value;
  local_88 = local_98;
  local_80 = local_90;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_88);
  std::operator+(&local_58,"glGetIntegerv(",&local_78);
  std::operator+(&local_38,&local_58,")");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  glu::checkError(err,pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                  ,0x41);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || (local_18 % 4 != 0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      return local_18 / 4;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  EVar3 = glu::getGettableStateStr(local_14);
  local_118 = EVar3.m_getName;
  local_110 = EVar3.m_value;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_108,&local_118);
  std::operator+(&local_e8,"Expected ",&local_108);
  std::operator+(&local_c8,&local_e8," to be divisible by 4");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tcu::TestError::TestError
            (this,pcVar2,"value%4 == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
             ,0x42);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

static int getVectorsFromComps (const glw::Functions& gl, deUint32 pname)
{
	int value = -1;
	gl.getIntegerv(pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegerv(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	TCU_CHECK_MSG(value%4 == 0, ("Expected " + glu::getGettableStateStr((int)pname).toString() + " to be divisible by 4").c_str());
	return value/4;
}